

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

bool __thiscall
btGeneric6DofConstraint::testAngularLimitMotor(btGeneric6DofConstraint *this,int axis_index)

{
  btScalar test_value;
  
  test_value = btAdjustAngleToLimits
                         ((this->m_calculatedAxisAngleDiff).m_floats[axis_index],
                          this->m_angularLimits[axis_index].m_loLimit,
                          this->m_angularLimits[axis_index].m_hiLimit);
  this->m_angularLimits[axis_index].m_currentPosition = test_value;
  btRotationalLimitMotor::testLimitValue(this->m_angularLimits + axis_index,test_value);
  return this->m_angularLimits[axis_index].m_enableMotor != false ||
         this->m_angularLimits[axis_index].m_currentLimit != 0;
}

Assistant:

bool btGeneric6DofConstraint::testAngularLimitMotor(int axis_index)
{
	btScalar angle = m_calculatedAxisAngleDiff[axis_index];
	angle = btAdjustAngleToLimits(angle, m_angularLimits[axis_index].m_loLimit, m_angularLimits[axis_index].m_hiLimit);
	m_angularLimits[axis_index].m_currentPosition = angle;
	//test limits
	m_angularLimits[axis_index].testLimitValue(angle);
	return m_angularLimits[axis_index].needApplyTorques();
}